

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_geometry_device.cpp
# Opt level: O2

uint embree::addCube(RTCScene scene_i)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  
  uVar3 = rtcNewGeometry(g_device,0);
  _DAT_002aad58 = (undefined8 *)alignedUSMMalloc(0xc0,0x10,DEVICE_READ_ONLY);
  _DAT_002aad60 = (undefined8 *)alignedUSMMalloc(0x80,0x10,DEVICE_READ_ONLY);
  puVar4 = (undefined8 *)rtcSetNewGeometryBuffer(uVar3,1,0,0x9003,0x10,8);
  puVar1 = _DAT_002aad60;
  *_DAT_002aad60 = 0;
  puVar1[1] = 0;
  *puVar4 = 0xbf800000bf800000;
  *(undefined4 *)(puVar4 + 1) = 0xbf800000;
  puVar1 = _DAT_002aad60;
  _DAT_002aad60[2] = 0;
  puVar1[3] = 0x3f800000;
  puVar4[2] = 0xbf800000bf800000;
  *(undefined4 *)(puVar4 + 3) = 0x3f800000;
  puVar1 = _DAT_002aad60;
  _DAT_002aad60[4] = 0x3f80000000000000;
  puVar1[5] = 0;
  puVar4[4] = 0x3f800000bf800000;
  *(undefined4 *)(puVar4 + 5) = 0xbf800000;
  puVar1[6] = 0x3f80000000000000;
  puVar1[7] = 0x3f800000;
  puVar4[6] = 0x3f800000bf800000;
  *(undefined4 *)(puVar4 + 7) = 0x3f800000;
  puVar1[8] = 0x3f800000;
  puVar1[9] = 0;
  puVar4[8] = 0xbf8000003f800000;
  *(undefined4 *)(puVar4 + 9) = 0xbf800000;
  puVar1[10] = 0x3f800000;
  puVar1[0xb] = 0x3f800000;
  puVar4[10] = 0xbf8000003f800000;
  *(undefined4 *)(puVar4 + 0xb) = 0x3f800000;
  puVar1[0xc] = 0x3f8000003f800000;
  puVar1[0xd] = 0;
  puVar4[0xc] = 0x3f8000003f800000;
  *(undefined4 *)(puVar4 + 0xd) = 0xbf800000;
  *(undefined4 *)(puVar1 + 0xe) = 0x3f800000;
  *(undefined4 *)((long)puVar1 + 0x74) = 0x3f800000;
  *(undefined4 *)(puVar1 + 0xf) = 0x3f800000;
  *(undefined4 *)((long)puVar1 + 0x7c) = 0;
  puVar4[0xe] = 0x3f8000003f800000;
  *(undefined4 *)(puVar4 + 0xf) = 0x3f800000;
  puVar4 = (undefined8 *)rtcSetNewGeometryBuffer(uVar3,0,0,0x5003,0xc,0xc);
  puVar1 = _DAT_002aad58;
  *_DAT_002aad58 = 0x3f800000;
  puVar1[1] = 0;
  *puVar4 = 0x100000000;
  *(undefined4 *)(puVar4 + 1) = 2;
  puVar1 = _DAT_002aad58;
  _DAT_002aad58[2] = 0x3f800000;
  puVar1[3] = 0;
  *(undefined8 *)((long)puVar4 + 0xc) = 0x300000001;
  *(undefined4 *)((long)puVar4 + 0x14) = 2;
  puVar1 = _DAT_002aad58;
  _DAT_002aad58[4] = 0x3f80000000000000;
  puVar1[5] = 0;
  puVar4[3] = 0x600000004;
  *(undefined4 *)(puVar4 + 4) = 5;
  puVar1[6] = 0x3f80000000000000;
  puVar1[7] = 0;
  *(undefined8 *)((long)puVar4 + 0x24) = 0x600000005;
  *(undefined4 *)((long)puVar4 + 0x2c) = 7;
  puVar1[8] = 0x3f0000003f000000;
  puVar1[9] = 0x3f0000003f000000;
  puVar4[6] = 0x400000000;
  *(undefined4 *)(puVar4 + 7) = 1;
  puVar1[10] = 0x3f0000003f000000;
  puVar1[0xb] = 0x3f0000003f000000;
  *(undefined8 *)((long)puVar4 + 0x3c) = 0x400000001;
  *(undefined4 *)((long)puVar4 + 0x44) = 5;
  puVar1[0xc] = 0x3f8000003f800000;
  puVar1[0xd] = 0x3f8000003f800000;
  puVar4[9] = 0x300000002;
  *(undefined4 *)(puVar4 + 10) = 6;
  puVar1[0xe] = 0x3f8000003f800000;
  puVar1[0xf] = 0x3f8000003f800000;
  *(undefined8 *)((long)puVar4 + 0x54) = 0x700000003;
  *(undefined4 *)((long)puVar4 + 0x5c) = 6;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0x3f800000;
  puVar4[0xc] = 0x200000000;
  *(undefined4 *)(puVar4 + 0xd) = 4;
  puVar1[0x12] = 0;
  puVar1[0x13] = 0x3f800000;
  *(undefined8 *)((long)puVar4 + 0x6c) = 0x600000002;
  *(undefined4 *)((long)puVar4 + 0x74) = 4;
  puVar1[0x14] = 0x3f8000003f800000;
  puVar1[0x15] = 0;
  puVar4[0xf] = 0x500000001;
  *(undefined4 *)(puVar4 + 0x10) = 3;
  puVar1[0x16] = 0x3f8000003f800000;
  puVar1[0x17] = 0;
  *(undefined8 *)((long)puVar4 + 0x84) = 0x500000003;
  *(undefined4 *)((long)puVar4 + 0x8c) = 7;
  rtcSetGeometryVertexAttributeCount(uVar3,1);
  rtcSetSharedGeometryBuffer(uVar3,2,0,0x9003,_DAT_002aad60,0,0x10);
  rtcCommitGeometry(uVar3);
  uVar2 = rtcAttachGeometry(scene_i,uVar3);
  rtcReleaseGeometry(uVar3);
  return uVar2;
}

Assistant:

unsigned int addCube (RTCScene scene_i)
{
  /* create a triangulated cube with 12 triangles and 8 vertices */
  RTCGeometry mesh = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_TRIANGLE);

  /* create face and vertex color arrays */
  data.face_colors = (Vec3fa*) alignedUSMMalloc((12)*sizeof(Vec3fa),16);
  data.vertex_colors = (Vec3fa*) alignedUSMMalloc((8)*sizeof(Vec3fa),16);

  /* set vertices and vertex colors */
  Vertex* vertices = (Vertex*) rtcSetNewGeometryBuffer(mesh,RTC_BUFFER_TYPE_VERTEX,0,RTC_FORMAT_FLOAT3,sizeof(Vertex),8);
  data.vertex_colors[0] = Vec3fa(0,0,0); vertices[0].x = -1; vertices[0].y = -1; vertices[0].z = -1;
  data.vertex_colors[1] = Vec3fa(0,0,1); vertices[1].x = -1; vertices[1].y = -1; vertices[1].z = +1;
  data.vertex_colors[2] = Vec3fa(0,1,0); vertices[2].x = -1; vertices[2].y = +1; vertices[2].z = -1;
  data.vertex_colors[3] = Vec3fa(0,1,1); vertices[3].x = -1; vertices[3].y = +1; vertices[3].z = +1;
  data.vertex_colors[4] = Vec3fa(1,0,0); vertices[4].x = +1; vertices[4].y = -1; vertices[4].z = -1;
  data.vertex_colors[5] = Vec3fa(1,0,1); vertices[5].x = +1; vertices[5].y = -1; vertices[5].z = +1;
  data.vertex_colors[6] = Vec3fa(1,1,0); vertices[6].x = +1; vertices[6].y = +1; vertices[6].z = -1;
  data.vertex_colors[7] = Vec3fa(1,1,1); vertices[7].x = +1; vertices[7].y = +1; vertices[7].z = +1;

  /* set triangles and face colors */
  int tri = 0;
  Triangle* triangles = (Triangle*) rtcSetNewGeometryBuffer(mesh,RTC_BUFFER_TYPE_INDEX,0,RTC_FORMAT_UINT3,sizeof(Triangle),12);

  // left side
  data.face_colors[tri] = Vec3fa(1,0,0); triangles[tri].v0 = 0; triangles[tri].v1 = 1; triangles[tri].v2 = 2; tri++;
  data.face_colors[tri] = Vec3fa(1,0,0); triangles[tri].v0 = 1; triangles[tri].v1 = 3; triangles[tri].v2 = 2; tri++;

  // right side
  data.face_colors[tri] = Vec3fa(0,1,0); triangles[tri].v0 = 4; triangles[tri].v1 = 6; triangles[tri].v2 = 5; tri++;
  data.face_colors[tri] = Vec3fa(0,1,0); triangles[tri].v0 = 5; triangles[tri].v1 = 6; triangles[tri].v2 = 7; tri++;

  // bottom side
  data.face_colors[tri] = Vec3fa(0.5f);  triangles[tri].v0 = 0; triangles[tri].v1 = 4; triangles[tri].v2 = 1; tri++;
  data.face_colors[tri] = Vec3fa(0.5f);  triangles[tri].v0 = 1; triangles[tri].v1 = 4; triangles[tri].v2 = 5; tri++;

  // top side
  data.face_colors[tri] = Vec3fa(1.0f);  triangles[tri].v0 = 2; triangles[tri].v1 = 3; triangles[tri].v2 = 6; tri++;
  data.face_colors[tri] = Vec3fa(1.0f);  triangles[tri].v0 = 3; triangles[tri].v1 = 7; triangles[tri].v2 = 6; tri++;

  // front side
  data.face_colors[tri] = Vec3fa(0,0,1); triangles[tri].v0 = 0; triangles[tri].v1 = 2; triangles[tri].v2 = 4; tri++;
  data.face_colors[tri] = Vec3fa(0,0,1); triangles[tri].v0 = 2; triangles[tri].v1 = 6; triangles[tri].v2 = 4; tri++;

  // back side
  data.face_colors[tri] = Vec3fa(1,1,0); triangles[tri].v0 = 1; triangles[tri].v1 = 5; triangles[tri].v2 = 3; tri++;
  data.face_colors[tri] = Vec3fa(1,1,0); triangles[tri].v0 = 3; triangles[tri].v1 = 5; triangles[tri].v2 = 7; tri++;

  rtcSetGeometryVertexAttributeCount(mesh,1);
  rtcSetSharedGeometryBuffer(mesh,RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE,0,RTC_FORMAT_FLOAT3,data.vertex_colors,0,sizeof(Vec3fa),8);
  
  rtcCommitGeometry(mesh);
  unsigned int geomID = rtcAttachGeometry(scene_i,mesh);
  rtcReleaseGeometry(mesh);
  return geomID;
}